

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImVector<ImGuiShrinkWidthItem> *this;
  float fVar1;
  undefined1 auVar2 [16];
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImGuiTabItemFlags IVar9;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  ImGuiID IVar14;
  ImGuiTabItem *pIVar15;
  ImGuiTabItem *pIVar16;
  char *pcVar17;
  ImGuiShrinkWidthItem *pIVar18;
  ImGuiTabItem *pIVar19;
  byte bVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  int tab_n;
  int iVar25;
  int iVar26;
  int iVar27;
  int tab_src_n;
  int iVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  ImGuiID local_12c;
  float local_11c;
  undefined1 local_118 [16];
  ImVec2 local_100;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec2 local_a8;
  ImVec4 local_98;
  undefined8 local_80;
  ImVec2 local_78;
  ulong local_70;
  undefined1 local_68 [16];
  ImVec4 arrow_col;
  
  pIVar11 = GImGui;
  tab_bar->WantLayout = false;
  sections[1].Width = 0.0;
  sections[1].Spacing = 0.0;
  sections[2].TabCount = 0;
  sections[2].Width = 0.0;
  sections[0].TabCount = 0;
  sections[0].Width = 0.0;
  sections[0].Spacing = 0.0;
  sections[1].TabCount = 0;
  sections[2].Spacing = 0.0;
  bVar20 = 0;
  iVar25 = 0;
  for (iVar28 = 0; iVar26 = (tab_bar->Tabs).Size, iVar28 < iVar26; iVar28 = iVar28 + 1) {
    pIVar15 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar28);
    if ((pIVar15->LastFrameVisible < tab_bar->PrevFrameVisible) || (pIVar15->WantClose == true)) {
      IVar14 = pIVar15->ID;
      if (tab_bar->VisibleTabId == IVar14) {
        tab_bar->VisibleTabId = 0;
      }
      if (tab_bar->SelectedTabId == IVar14) {
        tab_bar->SelectedTabId = 0;
      }
      if (tab_bar->NextSelectedTabId == IVar14) {
        tab_bar->NextSelectedTabId = 0;
      }
    }
    else {
      if (iVar28 != iVar25) {
        pIVar15 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar28);
        pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar25);
        IVar9 = pIVar15->Flags;
        pIVar3 = pIVar15->Window;
        iVar26 = pIVar15->LastFrameVisible;
        iVar27 = pIVar15->LastFrameSelected;
        fVar31 = pIVar15->Offset;
        fVar32 = pIVar15->Width;
        auVar2 = *(undefined1 (*) [16])((long)&pIVar15->Offset + 3);
        pIVar16->ID = pIVar15->ID;
        pIVar16->Flags = IVar9;
        pIVar16->Window = pIVar3;
        pIVar16->LastFrameVisible = iVar26;
        pIVar16->LastFrameSelected = iVar27;
        pIVar16->Offset = fVar31;
        pIVar16->Width = fVar32;
        *(undefined1 (*) [16])((long)&pIVar16->Offset + 3) = auVar2;
      }
      pIVar15 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar25);
      pIVar15->IndexDuringLayout = (ImS16)iVar25;
      uVar29 = pIVar15->Flags;
      lVar21 = 0;
      if ((uVar29 & 0x40) == 0) {
        lVar21 = (ulong)((char)(byte)uVar29 < '\0') + 1;
      }
      if (0 < iVar25) {
        pIVar15 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar25 + -1);
        bVar20 = (pIVar15->Flags & 0x40U) == 0 & (byte)uVar29 >> 6 | bVar20 |
                 ((uVar29 & 0xc0) != 0x80 && (pIVar15->Flags & 0xc0U) == 0x80);
      }
      sections[lVar21].TabCount = sections[lVar21].TabCount + 1;
      iVar25 = iVar25 + 1;
    }
  }
  if (iVar26 != iVar25) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,iVar25);
  }
  if (bVar20 != 0) {
    qsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x30,TabItemComparerBySection);
  }
  iVar25 = sections[0].TabCount;
  local_70 = (ulong)(uint)sections[1].TabCount;
  iVar28 = sections[2].TabCount;
  local_11c = 0.0;
  fVar31 = 0.0;
  if (0 < sections[1].TabCount + sections[2].TabCount && 0 < sections[0].TabCount) {
    fVar31 = (pIVar11->Style).ItemInnerSpacing.x;
  }
  sections[0].Spacing = fVar31;
  if (0 < sections[2].TabCount && 0 < sections[1].TabCount) {
    local_11c = (pIVar11->Style).ItemInnerSpacing.x;
  }
  sections[1].Spacing = local_11c;
  local_12c = tab_bar->NextSelectedTabId;
  if (local_12c != 0) {
    tab_bar->SelectedTabId = local_12c;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar12 = TabBarProcessReorder(tab_bar);
    if ((bVar12) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      local_12c = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar10 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar3 = GImGui->CurrentWindow;
    fVar32 = (GImGui->Style).FramePadding.y;
    fVar34 = GImGui->FontSize;
    IVar4 = (pIVar3->DC).CursorPos;
    fVar33 = (tab_bar->BarRect).Min.y;
    (pIVar3->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar32;
    (pIVar3->DC).CursorPos.y = fVar33;
    (tab_bar->BarRect).Min.x = fVar34 + fVar32 + (tab_bar->BarRect).Min.x;
    arrow_col.x = (pIVar10->Style).Colors[0].x;
    arrow_col.y = (pIVar10->Style).Colors[0].y;
    uVar5 = (pIVar10->Style).Colors[0].z;
    uVar6 = (pIVar10->Style).Colors[0].w;
    arrow_col.w = (float)uVar6 * 0.5;
    arrow_col.z = (float)uVar5;
    iVar26 = 0;
    PushStyleColor(0,&arrow_col);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    bVar12 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar12) {
      local_118._0_8_ = pIVar3;
      pIVar15 = (ImGuiTabItem *)0x0;
      local_100 = IVar4;
      for (; iVar26 < (tab_bar->Tabs).Size; iVar26 = iVar26 + 1) {
        pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar26);
        if ((pIVar16->Flags & 0x200000) == 0) {
          pcVar17 = ImGuiTabBar::GetTabName(tab_bar,pIVar16);
          local_98.x = 0.0;
          local_98.y = 0.0;
          bVar12 = Selectable(pcVar17,tab_bar->SelectedTabId == pIVar16->ID,0,(ImVec2 *)&local_98);
          if (bVar12) {
            pIVar15 = pIVar16;
          }
        }
      }
      EndPopup();
      (pIVar3->DC).CursorPos = local_100;
      if (pIVar15 != (ImGuiTabItem *)0x0) {
        local_12c = pIVar15->ID;
        tab_bar->SelectedTabId = local_12c;
      }
    }
    else {
      (pIVar3->DC).CursorPos = IVar4;
    }
  }
  shrink_buffer_indexes[0] = 0;
  shrink_buffer_indexes[1] = iVar28 + iVar25;
  shrink_buffer_indexes[2] = iVar25;
  this = &pIVar11->ShrinkWidthBuffer;
  ImVector<ImGuiShrinkWidthItem>::resize(this,(tab_bar->Tabs).Size);
  local_100 = (ImVec2)((ulong)local_100 & 0xffffffff00000000);
  pIVar15 = (ImGuiTabItem *)0x0;
  uVar29 = 0xffffffff;
  for (iVar28 = 0; iVar26 = (tab_bar->Tabs).Size, iVar28 < iVar26; iVar28 = iVar28 + 1) {
    pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar28);
    if (pIVar16->LastFrameVisible < tab_bar->PrevFrameVisible) {
      __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                    ,0x1bc9,"void ImGui::TabBarLayout(ImGuiTabBar *)");
    }
    if (((pIVar15 == (ImGuiTabItem *)0x0) ||
        (pIVar15->LastFrameSelected < pIVar16->LastFrameSelected)) &&
       ((pIVar16->Flags & 0x200000) == 0)) {
      pIVar15 = pIVar16;
    }
    IVar14 = pIVar16->ID;
    uVar23 = (uint)local_100.x & 0xff;
    if (IVar14 == tab_bar->SelectedTabId) {
      uVar23 = 1;
    }
    local_100.x = (float)uVar23;
    if ((local_12c == 0) && (local_12c = IVar14, pIVar11->NavJustMovedToId != IVar14)) {
      local_12c = 0;
    }
    pcVar17 = ImGuiTabBar::GetTabName(tab_bar,pIVar16);
    IVar4 = TabItemCalcSize(pcVar17,((uint)pIVar16->Flags >> 0x14 & 1) == 0);
    pIVar16->ContentWidth = IVar4.x;
    uVar23 = ((char)pIVar16->Flags < '\0') + 1;
    if ((pIVar16->Flags & 0x40U) != 0) {
      uVar23 = 0;
    }
    fVar32 = 0.0;
    if (uVar23 == uVar29) {
      fVar32 = (pIVar11->Style).ItemInnerSpacing.x;
    }
    sections[uVar23].Width = IVar4.x + fVar32 + sections[uVar23].Width;
    iVar26 = shrink_buffer_indexes[uVar23];
    shrink_buffer_indexes[uVar23] = iVar26 + 1;
    pIVar18 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar26);
    pIVar18->Index = iVar28;
    fVar32 = pIVar16->ContentWidth;
    local_118._0_4_ = fVar32;
    pIVar18 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar26);
    pIVar18->Width = fVar32;
    if (pIVar16->ContentWidth <= 0.0) {
      __assert_fail("tab->ContentWidth > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                    ,0x1be3,"void ImGui::TabBarLayout(ImGuiTabBar *)");
    }
    pIVar16->Width = pIVar16->ContentWidth;
    uVar29 = uVar23;
  }
  fVar32 = 0.0;
  for (lVar21 = 8; lVar21 != 0x2c; lVar21 = lVar21 + 0xc) {
    fVar32 = fVar32 + *(float *)((long)sections + lVar21 + -4) +
                      *(float *)((long)&sections[0].TabCount + lVar21);
  }
  tab_bar->WidthAllTabsIdeal = fVar32;
  pIVar10 = GImGui;
  fVar34 = (tab_bar->BarRect).Max.x;
  if (((1 < iVar26) && (fVar34 - (tab_bar->BarRect).Min.x < fVar32)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar3 = GImGui->CurrentWindow;
    fVar33 = GImGui->FontSize + -2.0;
    local_68 = ZEXT416((uint)fVar33);
    fVar32 = (GImGui->Style).FramePadding.y;
    local_a8.y = fVar32 + fVar32 + GImGui->FontSize;
    fVar33 = fVar33 + fVar33;
    local_118 = ZEXT416((uint)fVar33);
    local_78 = (pIVar3->DC).CursorPos;
    arrow_col.x = (GImGui->Style).Colors[0].x;
    arrow_col.y = (GImGui->Style).Colors[0].y;
    uVar7 = (GImGui->Style).Colors[0].z;
    uVar8 = (GImGui->Style).Colors[0].w;
    arrow_col.w = (float)uVar8 * 0.5;
    arrow_col.z = (float)uVar7;
    PushStyleColor(0,&arrow_col);
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_98.z = 0.0;
    local_98.w = 0.0;
    PushStyleColor(0x15,&local_98);
    local_80._0_4_ = (pIVar10->IO).KeyRepeatDelay;
    local_80._4_4_ = (pIVar10->IO).KeyRepeatRate;
    (pIVar10->IO).KeyRepeatDelay = 0.25;
    (pIVar10->IO).KeyRepeatRate = 0.2;
    fVar32 = (tab_bar->BarRect).Min.x;
    fVar34 = (tab_bar->BarRect).Max.x - fVar33;
    uVar29 = -(uint)(fVar34 <= fVar32);
    fVar34 = (float)(uVar29 & (uint)fVar32 | ~uVar29 & (uint)fVar34);
    fVar32 = (tab_bar->BarRect).Min.y;
    (pIVar3->DC).CursorPos.x = fVar34;
    (pIVar3->DC).CursorPos.y = fVar32;
    local_a8.x = (float)local_68._0_4_;
    IVar4.y = local_a8.y;
    IVar4.x = (float)local_68._0_4_;
    bVar12 = ArrowButtonEx("##<",0,IVar4,0x410);
    fVar32 = (tab_bar->BarRect).Min.y;
    (pIVar3->DC).CursorPos.x = fVar34 + (float)local_68._0_4_;
    (pIVar3->DC).CursorPos.y = fVar32;
    bVar13 = ArrowButtonEx("##>",1,local_a8,0x410);
    iVar28 = -(uint)bVar12;
    if (bVar13) {
      iVar28 = 1;
    }
    PopStyleColor(2);
    (pIVar10->IO).KeyRepeatDelay = (float)(undefined4)local_80;
    (pIVar10->IO).KeyRepeatRate = (float)local_80._4_4_;
    if ((iVar28 == 0) ||
       (pIVar16 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId), pIVar16 == (ImGuiTabItem *)0x0)
       ) {
      pIVar16 = (ImGuiTabItem *)0x0;
    }
    else {
      iVar26 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar16);
      iVar27 = iVar26 + iVar28;
      pIVar16 = (ImGuiTabItem *)0x0;
      while (pIVar16 == (ImGuiTabItem *)0x0) {
        if ((iVar27 < 0) || (iVar24 = iVar27, (tab_bar->Tabs).Size <= iVar27)) {
          iVar24 = iVar26;
        }
        pIVar19 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar24);
        pIVar16 = pIVar19;
        if ((pIVar19->Flags & 0x200000) != 0) {
          iVar26 = iVar26 + iVar28;
          iVar27 = iVar27 + iVar28;
          if ((-1 < iVar27) && (pIVar16 = (ImGuiTabItem *)0x0, (tab_bar->Tabs).Size <= iVar27)) {
            pIVar16 = pIVar19;
          }
        }
      }
    }
    (pIVar3->DC).CursorPos = local_78;
    fVar34 = (tab_bar->BarRect).Max.x - (fVar33 + 1.0);
    (tab_bar->BarRect).Max.x = fVar34;
    if ((pIVar16 != (ImGuiTabItem *)0x0) &&
       (local_12c = pIVar16->ID, (pIVar16->Flags & 0x200000) == 0)) {
      tab_bar->SelectedTabId = local_12c;
    }
  }
  fVar32 = sections[0].Width + fVar31 + sections[2].Width + 0.0;
  fVar34 = fVar34 - (tab_bar->BarRect).Min.x;
  if (fVar32 < fVar34) {
    fVar33 = (sections[1].Width + local_11c) -
             ((fVar34 - (sections[0].Width + fVar31)) - (sections[2].Width + 0.0));
    if (0.0 <= fVar33) goto LAB_002d09a5;
  }
  else {
    fVar33 = fVar32 - fVar34;
LAB_002d09a5:
    if ((0.0 < fVar33) && ((fVar34 <= fVar32 || ((tab_bar->Flags & 0x40U) != 0)))) {
      uVar29 = (uint)local_70;
      if (fVar34 <= fVar32) {
        uVar29 = sections[2].TabCount + iVar25;
      }
      uVar22 = (ulong)(uint)(sections[2].TabCount + iVar25);
      if (fVar34 <= fVar32) {
        uVar22 = 0;
      }
      iVar28 = (int)uVar22;
      ShrinkWidths((pIVar11->ShrinkWidthBuffer).Data + iVar28,uVar29,fVar33);
      while (iVar26 = (int)uVar22, iVar26 < (int)(iVar28 + uVar29)) {
        pIVar18 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar26);
        pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,pIVar18->Index);
        pIVar18 = ImVector<ImGuiShrinkWidthItem>::operator[](this,iVar26);
        if (-1 < (int)pIVar18->Width) {
          fVar32 = (float)(int)pIVar18->Width;
          uVar22 = (ulong)((char)pIVar16->Flags < '\0') + 1;
          if ((pIVar16->Flags & 0x40U) != 0) {
            uVar22 = 0;
          }
          sections[uVar22].Width = sections[uVar22].Width - (pIVar16->Width - fVar32);
          pIVar16->Width = fVar32;
        }
        uVar22 = (ulong)(iVar26 + 1);
      }
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  iVar28 = 0;
  fVar32 = 0.0;
  for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
    local_118._0_4_ = fVar32;
    if ((lVar21 == 2) &&
       (local_118._0_4_ = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - sections[2].Width,
       local_118._0_4_ = ~-(uint)((float)local_118._0_4_ <= 0.0) & local_118._0_4_,
       fVar32 <= (float)local_118._0_4_)) {
      local_118._0_4_ = fVar32;
    }
    iVar26 = sections[lVar21].TabCount;
    iVar27 = 0;
    iVar24 = 0;
    if (0 < iVar26) {
      iVar27 = iVar26;
      iVar24 = 0;
    }
    for (; iVar27 != iVar24; iVar24 = iVar24 + 1) {
      pIVar16 = ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,iVar28 + iVar24);
      pIVar16->Offset = (float)local_118._0_4_;
      pIVar16->NameOffset = -1;
      fVar32 = 0.0;
      if (iVar24 < iVar26 + -1) {
        fVar32 = (pIVar11->Style).ItemInnerSpacing.x;
      }
      local_118._0_4_ = (float)local_118._0_4_ + fVar32 + pIVar16->Width;
    }
    fVar32 = sections[lVar21].Spacing;
    fVar34 = sections[lVar21].Width + fVar32;
    tab_bar->WidthAllTabs = (float)(-(uint)(0.0 <= fVar34) & (uint)fVar34) + tab_bar->WidthAllTabs;
    fVar32 = (float)local_118._0_4_ + fVar32;
    iVar28 = iVar26 + iVar28;
  }
  ImVector<char>::resize(&(tab_bar->TabsNames).Buf,0);
  if (((ulong)local_100 & 1) == 0) {
    tab_bar->SelectedTabId = 0;
LAB_002d0afd:
    IVar14 = 0;
    if ((tab_bar->NextSelectedTabId == 0) && (IVar14 = 0, pIVar15 != (ImGuiTabItem *)0x0)) {
      local_12c = pIVar15->ID;
      tab_bar->SelectedTabId = local_12c;
      IVar14 = local_12c;
    }
  }
  else {
    IVar14 = tab_bar->SelectedTabId;
    if (IVar14 == 0) goto LAB_002d0afd;
  }
  tab_bar->VisibleTabId = IVar14;
  tab_bar->VisibleTabWasSubmitted = false;
  pIVar3 = pIVar11->NavWindowingTarget;
  if (((pIVar3 != (ImGuiWindow *)0x0) && (pIVar3->DockNode != (ImGuiDockNode *)0x0)) &&
     (pIVar3->DockNode->TabBar == tab_bar)) {
    local_12c = pIVar3->ID;
    tab_bar->VisibleTabId = local_12c;
  }
  if (((local_12c != 0) &&
      (pIVar15 = TabBarFindTabByID(tab_bar,local_12c), pIVar15 != (ImGuiTabItem *)0x0)) &&
     ((pIVar15->Flags & 0xc0) == 0)) {
    fVar32 = GImGui->FontSize;
    iVar28 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIVar15);
    fVar34 = (tab_bar->BarRect).Max.x;
    fVar33 = (tab_bar->BarRect).Min.x;
    fVar30 = pIVar15->Offset - sections[0].Width;
    fVar35 = fVar32;
    if (iVar28 < iVar25) {
      fVar35 = -0.0;
    }
    fVar35 = fVar30 - fVar35;
    fVar1 = pIVar15->Width;
    if ((tab_bar->Tabs).Size - sections[2].TabCount <= iVar28 + 1) {
      fVar32 = 1.0;
    }
    tab_bar->ScrollingTargetDistToVisibility = 0.0;
    fVar32 = fVar30 + fVar1 + fVar32;
    if ((fVar35 < tab_bar->ScrollingTarget) ||
       (fVar34 = (((fVar34 - fVar33) - sections[0].Width) - sections[2].Width) - local_11c,
       fVar34 <= fVar32 - fVar35)) {
      fVar33 = tab_bar->ScrollingAnim - fVar32;
    }
    else {
      if (fVar32 - fVar34 <= tab_bar->ScrollingTarget) goto LAB_002d0d11;
      fVar33 = (fVar35 - fVar34) - tab_bar->ScrollingAnim;
      fVar35 = fVar32 - fVar34;
    }
    tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar33) & (uint)fVar33);
    tab_bar->ScrollingTarget = fVar35;
  }
LAB_002d0d11:
  fVar32 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
  tab_bar->ScrollingAnim = fVar32;
  fVar34 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
  tab_bar->ScrollingTarget = fVar34;
  if ((fVar32 != fVar34) || (NAN(fVar32) || NAN(fVar34))) {
    fVar33 = pIVar11->FontSize;
    fVar35 = fVar33 * 70.0;
    uVar29 = -(uint)(fVar35 <= tab_bar->ScrollingSpeed);
    fVar30 = ABS(fVar34 - fVar32) / 0.3;
    fVar35 = (float)(~uVar29 & (uint)fVar35 | (uint)tab_bar->ScrollingSpeed & uVar29);
    uVar29 = -(uint)(fVar30 <= fVar35);
    fVar30 = (float)(~uVar29 & (uint)fVar30 | uVar29 & (uint)fVar35);
    tab_bar->ScrollingSpeed = fVar30;
    fVar35 = fVar34;
    if ((pIVar11->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar33 * 10.0)) {
      fVar30 = fVar30 * (pIVar11->IO).DeltaTime;
      if (fVar34 <= fVar32) {
        fVar35 = fVar32;
        if (fVar34 < fVar32) {
          fVar32 = fVar32 - fVar30;
          uVar29 = -(uint)(fVar34 <= fVar32);
          fVar35 = (float)((uint)fVar32 & uVar29 | ~uVar29 & (uint)fVar34);
        }
      }
      else {
        fVar35 = fVar32 + fVar30;
        if (fVar34 <= fVar35) {
          fVar35 = fVar34;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar35;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  fVar32 = (tab_bar->BarRect).Max.x;
  tab_bar->ScrollingRectMinX = fVar31 + (tab_bar->BarRect).Min.x + sections[0].Width;
  tab_bar->ScrollingRectMaxX = (fVar32 - sections[2].Width) - local_11c;
  (pIVar11->CurrentWindow->DC).CursorPos = (tab_bar->BarRect).Min;
  arrow_col.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  arrow_col.x = tab_bar->WidthAllTabsIdeal;
  ItemSize((ImVec2 *)&arrow_col,(tab_bar->FramePadding).y);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab->NameOffset = -1;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // Clear name buffers
    tab_bar->TabsNames.Buf.resize(0);

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // CTRL+TAB can override visible tab temporarily
    if (g.NavWindowingTarget != NULL && g.NavWindowingTarget->DockNode && g.NavWindowingTarget->DockNode->TabBar == tab_bar)
        tab_bar->VisibleTabId = scroll_track_selected_tab_id = g.NavWindowingTarget->ID;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabsIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
}